

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

void __thiscall
jsonip::detail::struct_helper<C>::member_writer<jsonip::writer<true>>::operator()
          (member_writer<jsonip::writer<true>> *this,integral_c<int,_2> *param_1)

{
  writer<true>::new_member(*(writer<true> **)this,"c");
  writer<true>::new_bool(*(writer<true> **)this,*(bool *)(*(long *)(this + 8) + 0x20));
  return;
}

Assistant:

void operator()(const N&)
            {
                typedef boost::fusion::extension::struct_member_name<
                    T, N::value> name_t;
                typedef typename boost::fusion::result_of::value_at<T, N>::type
                    current_t;
                typedef typename calculate_helper<current_t>::type helper_t;

                w.new_member(name_t::call());
                helper_t::write(w, boost::fusion::at<N>(t));
            }